

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_trip.c
# Opt level: O0

greatest_test_res db_trip_store(void)

{
  undefined1 local_208 [8];
  trip_t record;
  feed_db_status_t res;
  feed_db_t db;
  
  memcpy(local_208,&DAT_002433a8,0x1cc);
  init_feed_db((feed_db_t *)&record.bikes_allowed,"tests_tdw0.db",1);
  setup_feed_db((feed_db_t *)&record.bikes_allowed);
  record.wheelchair_accessible =
       store_trip_db((trip_t *)local_208,(feed_db_t *)&record.bikes_allowed);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (record.wheelchair_accessible == FEED_DB_SUCCESS) {
    free_feed_db((feed_db_t *)&record.bikes_allowed);
    greatest_info.msg = (char *)0x0;
    db._36_4_ = 0;
  }
  else {
    fprintf(_stdout,"\nExpected: ");
    fprintf(_stdout,"%i",1);
    fprintf(_stdout,"\n     Got: ");
    fprintf(_stdout,"%i",(ulong)record.wheelchair_accessible);
    fprintf(_stdout,"\n");
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_database_records/tests-database_records_trip.c"
    ;
    greatest_info.fail_line = 0x1c;
    greatest_info.msg = (char *)db.conn;
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    db._36_4_ = 0xffffffff;
  }
  return db._36_4_;
}

Assistant:

TEST db_trip_store(void) {
    feed_db_t db;
    feed_db_status_t res;

    trip_t record = {
        .route_id = "245",
        .service_id = "12",
        .id = "t254-sl12-pAF-r120",
        .headsign = "Eagle Valley",
        .short_name = "lOrEM IpsuM",
        .direction_id = 1,
        .block_id = "1012",
        .shape_id = "175_shp",
        .wheelchair_accessible = WA_POSSIBLE,
        .bikes_allowed = BA_POSSIBLE
    };

    init_feed_db(&db, "tests_tdw0.db", 1);
    setup_feed_db(&db);

    res = store_trip_db(&record, &db);
    ASSERT_EQ_FMTm(db.error_msg, FEED_DB_SUCCESS, res, "%i");

    free_feed_db(&db);

    PASS();
}